

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O2

void __thiscall crnlib::dxt1_endpoint_optimizer::return_solution(dxt1_endpoint_optimizer *this)

{
  ushort uVar1;
  uint uVar2;
  results *prVar3;
  params *ppVar4;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *paVar5;
  uint8 uVar6;
  uint uVar7;
  bool bVar8;
  uint8 uVar9;
  ushort uVar10;
  ushort uVar11;
  uint uVar12;
  undefined4 *puVar13;
  uint uVar14;
  uint8 *__s;
  ulong uVar15;
  uint local_4c;
  undefined4 *local_48;
  uint8 *local_40;
  uint local_34;
  
  compute_selectors(this);
  uVar1 = (this->m_best_solution).m_coords.m_high_color;
  uVar11 = (this->m_best_solution).m_coords.m_low_color;
  bVar8 = uVar11 < uVar1;
  if ((this->m_best_solution).m_alpha_block != false) {
    bVar8 = uVar1 < uVar11;
  }
  prVar3 = this->m_pResults;
  prVar3->m_alternate_rounding = (this->m_best_solution).m_alternate_rounding;
  prVar3->m_enforce_selector = (this->m_best_solution).m_enforce_selector;
  prVar3->m_enforced_selector = (this->m_best_solution).m_enforced_selector;
  prVar3->m_reordered = bVar8;
  uVar10 = uVar1;
  if (bVar8 != false) {
    uVar10 = uVar11;
    uVar11 = uVar1;
  }
  prVar3->m_low_color = uVar11;
  prVar3->m_high_color = uVar10;
  puVar13 = &g_invTableColor;
  if (((this->m_best_solution).m_alpha_block & 1U) != 0) {
    puVar13 = &g_invTableAlpha;
  }
  local_48 = &g_invTableNull;
  if (bVar8 != false) {
    local_48 = puVar13;
  }
  ppVar4 = this->m_pParams;
  uVar14 = 0;
  if (ppVar4->m_pixels_have_alpha == true) {
    uVar14 = ppVar4->m_dxt1a_alpha_threshold << 0x18;
  }
  paVar5 = &ppVar4->m_pPixels->field_0;
  __s = prVar3->m_pSelectors;
  if ((this->m_unique_colors).m_size == 1 && ppVar4->m_pixels_have_alpha == false) {
    local_34 = paVar5->m_u32 | 0xff000000;
    uVar7 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            ::find_index(&this->m_unique_color_hash_map,&local_34);
    memset(__s,(uint)*(byte *)((long)local_48 +
                              (ulong)(this->m_best_solution).m_selectors.m_p
                                     [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar7].
                                                m_bits + 4)]),(ulong)this->m_pParams->m_num_pixels);
  }
  else {
    uVar2 = ppVar4->m_num_pixels;
    uVar15 = 0;
    uVar6 = '\0';
    local_4c = 0;
    local_40 = __s;
    do {
      uVar12 = paVar5[uVar15].m_u32;
      uVar9 = '\x03';
      if ((uVar14 <= uVar12) && (uVar12 = uVar12 | 0xff000000, uVar9 = uVar6, uVar12 != local_4c)) {
        local_4c = uVar12;
        uVar7 = hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                ::find_index(&this->m_unique_color_hash_map,&local_4c);
        uVar9 = *(uint8 *)((long)local_48 +
                          (ulong)(this->m_best_solution).m_selectors.m_p
                                 [*(uint *)((this->m_unique_color_hash_map).m_values.m_p[uVar7].
                                            m_bits + 4)]);
        __s = local_40;
        uVar6 = uVar9;
      }
      __s[uVar15] = uVar9;
      uVar15 = uVar15 + 1;
    } while (uVar2 != uVar15);
  }
  prVar3 = this->m_pResults;
  prVar3->m_alpha_block = (this->m_best_solution).m_alpha_block;
  prVar3->m_error = (this->m_best_solution).m_error;
  return;
}

Assistant:

void dxt1_endpoint_optimizer::return_solution()
    {
        compute_selectors();
        bool invert_selectors;

        if (m_best_solution.m_alpha_block)
        {
            invert_selectors = (m_best_solution.m_coords.m_low_color > m_best_solution.m_coords.m_high_color);
        }
        else
        {
            CRNLIB_ASSERT(m_best_solution.m_coords.m_low_color != m_best_solution.m_coords.m_high_color);

            invert_selectors = (m_best_solution.m_coords.m_low_color < m_best_solution.m_coords.m_high_color);
        }

        m_pResults->m_alternate_rounding = m_best_solution.m_alternate_rounding;
        m_pResults->m_enforce_selector = m_best_solution.m_enforce_selector;
        m_pResults->m_enforced_selector = m_best_solution.m_enforced_selector;
        m_pResults->m_reordered = invert_selectors;
        if (invert_selectors)
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_high_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_low_color;
        }
        else
        {
            m_pResults->m_low_color = m_best_solution.m_coords.m_low_color;
            m_pResults->m_high_color = m_best_solution.m_coords.m_high_color;
        }

        const uint8* pInvert_table = g_invTableNull;
        if (invert_selectors)
        {
            pInvert_table = m_best_solution.m_alpha_block ? g_invTableAlpha : g_invTableColor;
        }

        const uint alpha_thresh = m_pParams->m_pixels_have_alpha ? (m_pParams->m_dxt1a_alpha_threshold << 24U) : 0;

        const uint32* pSrc_pixels = reinterpret_cast<const uint32*>(m_pParams->m_pPixels);
        uint8* pDst_selectors = m_pResults->m_pSelectors;

        if ((m_unique_colors.size() == 1) && (!m_pParams->m_pixels_have_alpha))
        {
            uint32 c = utils::read_le32(pSrc_pixels);

            CRNLIB_ASSERT(c >= alpha_thresh);

            c |= 0xFF000000U;

            unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));
            CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

            uint unique_color_index = it->second;

            uint selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

            memset(pDst_selectors, selector, m_pParams->m_num_pixels);
        }
        else
        {
            uint8* pDst_selectors_end = pDst_selectors + m_pParams->m_num_pixels;

            uint8 prev_selector = 0;
            uint32 prev_color = 0;

            do
            {
                uint32 c = utils::read_le32(pSrc_pixels);
                pSrc_pixels++;

                uint8 selector = 3;

                if (c >= alpha_thresh)
                {
                    c |= 0xFF000000U;

                    if (c == prev_color)
                    {
                        selector = prev_selector;
                    }
                    else
                    {
                        unique_color_hash_map::const_iterator it(m_unique_color_hash_map.find(c));

                        CRNLIB_ASSERT(it != m_unique_color_hash_map.end());

                        uint unique_color_index = it->second;

                        selector = pInvert_table[m_best_solution.m_selectors[unique_color_index]];

                        prev_color = c;
                        prev_selector = selector;
                    }
                }

                *pDst_selectors++ = selector;
            } while (pDst_selectors != pDst_selectors_end);
        }

        m_pResults->m_alpha_block = m_best_solution.m_alpha_block;
        m_pResults->m_error = m_best_solution.m_error;
    }